

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laserDriver.h
# Opt level: O1

void publish_scan(rplidar_response_measurement_node_hq_t *nodes,LaserScan *scan_msg,
                 size_t node_count,uint32_t time_start,double scan_time,bool inverted,
                 float angle_min,float angle_max,float max_distance,uint32_t frame_id)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  _u8 *p_Var5;
  uint uVar6;
  undefined1 auVar7 [16];
  float fVar8;
  double dVar9;
  
  bVar2 = angle_max <= angle_min;
  fVar8 = angle_min;
  if (angle_max <= angle_min) {
    fVar8 = angle_max;
    angle_max = angle_min;
  }
  scan_msg->angle_min = 3.1415927 - angle_max;
  scan_msg->angle_max = 3.1415927 - fVar8;
  lVar1 = node_count - 1;
  auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar7._0_8_ = lVar1;
  auVar7._12_4_ = 0x45300000;
  dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
  scan_msg->angle_increment =
       (float)((double)((3.1415927 - fVar8) - (3.1415927 - angle_max)) / dVar9);
  scan_msg->scan_time = (float)scan_time;
  scan_msg->time_increment = (float)(scan_time / dVar9);
  scan_msg->range_min = 0.15;
  scan_msg->range_max = max_distance;
  if (bVar2 == inverted) {
    if (node_count != 0) {
      p_Var5 = &nodes->quality;
      do {
        fVar8 = ((float)*(uint *)(p_Var5 + -4) * 0.25) / 1000.0;
        uVar6 = -(uint)(fVar8 == 0.0);
        scan_msg->ranges[node_count - 1] = (float)(~uVar6 & (uint)fVar8 | uVar6 & 0x7f800000);
        scan_msg->intensities[node_count - 1] = (float)(*p_Var5 >> 2);
        p_Var5 = p_Var5 + 8;
        node_count = node_count - 1;
      } while (node_count != 0);
    }
  }
  else if (node_count != 0) {
    sVar3 = 0;
    do {
      fVar8 = ((float)nodes[sVar3].dist_mm_q2 * 0.25) / 1000.0;
      uVar6 = -(uint)(fVar8 == 0.0);
      scan_msg->ranges[sVar3] = (float)(uVar6 & 0x7f800000 | ~uVar6 & (uint)fVar8);
      scan_msg->intensities[sVar3] = (float)(nodes[sVar3].quality >> 2);
      sVar3 = sVar3 + 1;
    } while (node_count != sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," angle_max: ",0xc);
  poVar4 = std::ostream::_M_insert<double>((double)scan_msg->angle_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," angle_min: ",0xc);
  poVar4 = std::ostream::_M_insert<double>((double)scan_msg->angle_min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," angle_increment: ",0x12);
  poVar4 = std::ostream::_M_insert<double>((double)scan_msg->angle_increment);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_9ab,0xd);
  poVar4 = std::ostream::_M_insert<double>((double)scan_msg->scan_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," time_increment: ",0x11);
  poVar4 = std::ostream::_M_insert<double>((double)scan_msg->time_increment);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void publish_scan( rplidar_response_measurement_node_hq_t *nodes, \
		   slam::sensor::LaserScan &scan_msg,		   
		   size_t node_count, \
		   uint32_t time_start,\
		   double scan_time, bool inverted,\
		   float angle_min, float angle_max,\
		   float max_distance,\
		   uint32_t frame_id )
{
	
	//scan_msg.time_stamp = time_start;
	//scan_msg.frame_id = frame_id;
	
	bool reversed = ( angle_max > angle_min );
	if( reversed ){
		scan_msg.angle_min = M_PI - angle_max;
		scan_msg.angle_max = M_PI - angle_min;
	}	
	else{
		scan_msg.angle_min = M_PI - angle_min;
		scan_msg.angle_max = M_PI - angle_max;
	}
	
	scan_msg.angle_increment = ( scan_msg.angle_max - scan_msg.angle_min ) / (double)( node_count - 1 );
	
	scan_msg.scan_time = scan_time;
	scan_msg.time_increment = scan_time / ( double )( node_count - 1 );
	
	scan_msg.range_min = 0.15;
	scan_msg.range_max = max_distance ;//8.0

	bool reverse_data = ( !inverted && reversed ) || ( inverted && !reversed );
	if( !reverse_data ){
		for( size_t i = 0; i < node_count; i ++ ){
			float read_value = ( float )nodes[i].dist_mm_q2 / 4.0f / 1000;
			if( read_value == 0 ){
				scan_msg.ranges[i] = std::numeric_limits<float>::infinity();
			}
			else{
				scan_msg.ranges[i] = read_value;
			}
			scan_msg.intensities[i] = ( float )( nodes[i].quality >> 2 );
		}
	}
	else{
		for( size_t i = 0; i < node_count; i ++ ){
			float read_value = ( float )nodes[i].dist_mm_q2 / 4.0f / 1000;
			if( read_value == 0 ){
				scan_msg.ranges[ node_count - 1 - i ] = std::numeric_limits<float>::infinity(); 
			}
			else{
				scan_msg.ranges[ node_count - 1 - i ] = read_value;
			}
			scan_msg.intensities[ node_count - 1 - i ] =  ( float )( nodes[i].quality >> 2 );
		}
	}

	/* 打印测试结果 */
	//std::cout << "frame_id: " << scan_msg.frame_id<<std::endl;
	//std::cout << "time_stamp: "<< scan_msg.time_stamp<<std::endl;
	std::cout << " angle_max: " << scan_msg.angle_max << " angle_min: " << scan_msg.angle_min <<" angle_increment: "<<scan_msg.angle_increment<< std::endl;
	std::cout << " scan_time：" << scan_msg.scan_time << " time_increment: " << scan_msg.time_increment << std::endl;
	/*for (size_t i = 0; i < node_count; i++){
		std::cout << "ranges[" << i << "]: " << scan_msg.ranges[i] << std::endl;
	}*/
}